

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomOneAction.cpp
# Opt level: O2

ActionResults * __thiscall WhiteRoomOneAction::Drop(WhiteRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *pAVar4;
  itemType local_34;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == DISCUS) {
    local_34 = DISCUS;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_34);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 == BACKPACK) {
      local_34 = DISCUS;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_34);
      ItemWrapper::setLocation(pIVar3,W_ROOM1);
      pAVar4 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_30,
                 "The discus rolls around on the floor. You\'re backpack is .000024 kilograms lighter."
                 ,(allocator *)&local_34);
      ActionResults::ActionResults(pAVar4,CURRENT,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return pAVar4;
    }
  }
  pAVar4 = AbstractRoomAction::Drop(&this->super_AbstractRoomAction);
  return pAVar4;
}

Assistant:

ActionResults *WhiteRoomOneAction::Drop() {
    if(commands->getMainItem() == DISCUS && itemList->getValue(DISCUS)->getLocation() == BACKPACK) {
        itemList->getValue(DISCUS)->setLocation(W_ROOM1);
        return new ActionResults(CURRENT, "The discus rolls around on the floor. You're backpack is .000024 kilograms lighter.");
    }
    else {
        return AbstractRoomAction::Drop();
    }
}